

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O1

void __thiscall
Glucose::Heap<Glucose::SimpSolver::ElimLt>::percolateUp
          (Heap<Glucose::SimpSolver::ElimLt> *this,int i)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  
  piVar3 = (this->heap).data;
  iVar1 = piVar3[i];
  if (i != 0) {
    piVar4 = (this->indices).data;
    piVar5 = ((this->lt).n_occ)->data;
    do {
      uVar7 = i - 1;
      iVar6 = (int)uVar7 >> 1;
      iVar2 = piVar3[iVar6];
      if ((ulong)((long)piVar5[iVar2 * 2 + 1] * (long)piVar5[(long)iVar2 * 2]) <=
          (ulong)((long)piVar5[iVar1 * 2 + 1] * (long)piVar5[(long)iVar1 * 2])) break;
      piVar3[i] = iVar2;
      piVar4[piVar3[iVar6]] = i;
      i = iVar6;
    } while (1 < uVar7);
  }
  piVar3[i] = iVar1;
  (this->indices).data[iVar1] = i;
  return;
}

Assistant:

void percolateUp(int i)
    {
        int x  = heap[i];
        int p  = parent(i);
        
        while (i != 0 && lt(x, heap[p])){
            heap[i]          = heap[p];
            indices[heap[p]] = i;
            i                = p;
            p                = parent(p);
        }
        heap   [i] = x;
        indices[x] = i;
    }